

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getaddrinfo.c
# Opt level: O1

void ares_addrinfo_cat_cnames(ares_addrinfo_cname **head,ares_addrinfo_cname *tail)

{
  ares_addrinfo_cname *paVar1;
  ares_addrinfo_cname *paVar2;
  
  paVar1 = *head;
  if (*head != (ares_addrinfo_cname *)0x0) {
    do {
      paVar2 = paVar1;
      paVar1 = paVar2->next;
    } while (paVar1 != (ares_addrinfo_cname *)0x0);
    head = &paVar2->next;
  }
  *head = tail;
  return;
}

Assistant:

void ares_addrinfo_cat_cnames(struct ares_addrinfo_cname **head,
                              struct ares_addrinfo_cname  *tail)
{
  struct ares_addrinfo_cname *last = *head;
  if (!last) {
    *head = tail;
    return;
  }

  while (last->next) {
    last = last->next;
  }

  last->next = tail;
}